

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O0

void iothubtransportamqp_methods_unsubscribe
               (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle_local;
  
  if (iothubtransport_amqp_methods_handle == (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                ,"iothubtransportamqp_methods_unsubscribe",0x302,1,"NULL handle");
    }
  }
  else if (iothubtransport_amqp_methods_handle->subscribe_state == SUBSCRIBE_STATE_SUBSCRIBED) {
    messagereceiver_destroy(iothubtransport_amqp_methods_handle->message_receiver);
    iothubtransport_amqp_methods_handle->message_receiver = (MESSAGE_RECEIVER_HANDLE)0x0;
    messagesender_destroy(iothubtransport_amqp_methods_handle->message_sender);
    iothubtransport_amqp_methods_handle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
    link_destroy(iothubtransport_amqp_methods_handle->sender_link);
    iothubtransport_amqp_methods_handle->sender_link = (LINK_HANDLE)0x0;
    link_destroy(iothubtransport_amqp_methods_handle->receiver_link);
    iothubtransport_amqp_methods_handle->receiver_link = (LINK_HANDLE)0x0;
    iothubtransport_amqp_methods_handle->subscribe_state = SUBSCRIBE_STATE_NOT_SUBSCRIBED;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                ,"iothubtransportamqp_methods_unsubscribe",0x308,1,
                "unsubscribe called while not subscribed");
    }
  }
  return;
}

Assistant:

void iothubtransportamqp_methods_unsubscribe(IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle)
{
    if (iothubtransport_amqp_methods_handle == NULL)
    {
        LogError("NULL handle");
    }
    else
    {
        if (iothubtransport_amqp_methods_handle->subscribe_state != SUBSCRIBE_STATE_SUBSCRIBED)
        {
            LogError("unsubscribe called while not subscribed");
        }
        else
        {
            messagereceiver_destroy(iothubtransport_amqp_methods_handle->message_receiver);
            iothubtransport_amqp_methods_handle->message_receiver = NULL;
            messagesender_destroy(iothubtransport_amqp_methods_handle->message_sender);
            iothubtransport_amqp_methods_handle->message_sender = NULL;
            link_destroy(iothubtransport_amqp_methods_handle->sender_link);
            iothubtransport_amqp_methods_handle->sender_link = NULL;
            link_destroy(iothubtransport_amqp_methods_handle->receiver_link);
            iothubtransport_amqp_methods_handle->receiver_link = NULL;

            iothubtransport_amqp_methods_handle->subscribe_state = SUBSCRIBE_STATE_NOT_SUBSCRIBED;
        }
    }
}